

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

BSDF * createLambertian(SurfaceInteraction *si,Allocator alloc)

{
  BSDF *pBVar1;
  SampledSpectrum Kd;
  int local_64;
  DiffuseBxDF *local_60;
  polymorphic_allocator<std::byte> local_58;
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  
  local_58.memoryResource = alloc.memoryResource;
  pbrt::SampledSpectrum::SampledSpectrum(&local_50,1.0);
  pbrt::SampledSpectrum::SampledSpectrum(&local_40,0.0);
  local_64 = 0;
  local_60 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::DiffuseBxDF,pbrt::SampledSpectrum&,pbrt::SampledSpectrum,int>
                       (&local_58,&local_50,&local_40,&local_64);
  pBVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::BSDF,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::DiffuseBxDF*>
                     (&local_58,&(si->super_Interaction).wo,&(si->super_Interaction).n,
                      &(si->shading).n,&(si->shading).dpdu,&local_60);
  return pBVar1;
}

Assistant:

BSDF* createLambertian(const SurfaceInteraction& si, Allocator alloc) {
    SampledSpectrum Kd(1.);
    return alloc.new_object<BSDF>(
        si.wo, si.n, si.shading.n, si.shading.dpdu,
        alloc.new_object<DiffuseBxDF>(Kd, SampledSpectrum(0.), 0));
}